

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Expr * __thiscall kratos::Var::duplicate(Var *this,uint32_t count)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  Expr *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  uint32_t local_44;
  Expr *pEStack_40;
  uint32_t count_local;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  Expr *local_30;
  shared_ptr<kratos::VarDuplicated> expr;
  
  local_30 = (Expr *)0x0;
  local_44 = count;
  pEStack_40 = (Expr *)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::VarDuplicated,std::allocator<kratos::VarDuplicated>,kratos::Var*,unsigned_int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr,(VarDuplicated **)&local_30,
             (allocator<kratos::VarDuplicated> *)
             ((long)&expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),(Var **)&stack0xffffffffffffffc0,&local_44);
  std::__shared_ptr<kratos::VarDuplicated,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::VarDuplicated,kratos::VarDuplicated>
            ((__shared_ptr<kratos::VarDuplicated,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (VarDuplicated *)local_30);
  iVar3 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  pEStack_40 = local_30;
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Expr).super_Var.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Expr).super_Var.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)(CONCAT44(extraout_var,iVar3) + 400),&stack0xffffffffffffffc0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  pEVar2 = local_30;
  if (expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pEVar2;
}

Assistant:

Expr &Var::duplicate(uint32_t count) const {
    auto expr = std::make_shared<VarDuplicated>(const_cast<Var *>(this), count);
    generator()->add_expr(expr);
    return *expr;
}